

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleIndexVertexArray.h
# Opt level: O3

void __thiscall
btTriangleIndexVertexArray::addIndexedMesh
          (btTriangleIndexVertexArray *this,btIndexedMesh *mesh,PHY_ScalarType indexType)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btIndexedMesh *pbVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uchar *puVar9;
  uchar *puVar10;
  PHY_ScalarType PVar11;
  int iVar12;
  int iVar13;
  undefined4 uVar14;
  uint uVar15;
  btIndexedMesh *pbVar16;
  long lVar17;
  int iVar18;
  
  uVar15 = (this->m_indexedMeshes).m_size;
  if (uVar15 == (this->m_indexedMeshes).m_capacity) {
    iVar18 = 1;
    if (uVar15 != 0) {
      iVar18 = uVar15 * 2;
    }
    if ((int)uVar15 < iVar18) {
      if (iVar18 == 0) {
        pbVar16 = (btIndexedMesh *)0x0;
      }
      else {
        pbVar16 = (btIndexedMesh *)btAlignedAllocInternal((long)iVar18 * 0x30,0x10);
        uVar15 = (this->m_indexedMeshes).m_size;
      }
      if (0 < (int)uVar15) {
        lVar17 = 0;
        do {
          pbVar3 = (this->m_indexedMeshes).m_data;
          puVar1 = (undefined8 *)((long)&pbVar3->m_numTriangles + lVar17);
          uVar4 = *puVar1;
          uVar5 = puVar1[1];
          puVar1 = (undefined8 *)((long)&pbVar3->m_triangleIndexStride + lVar17);
          uVar6 = *puVar1;
          uVar7 = puVar1[1];
          puVar1 = (undefined8 *)((long)&pbVar3->m_vertexStride + lVar17);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pbVar16->m_vertexStride + lVar17);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          puVar1 = (undefined8 *)((long)&pbVar16->m_triangleIndexStride + lVar17);
          *puVar1 = uVar6;
          puVar1[1] = uVar7;
          puVar1 = (undefined8 *)((long)&pbVar16->m_numTriangles + lVar17);
          *puVar1 = uVar4;
          puVar1[1] = uVar5;
          lVar17 = lVar17 + 0x30;
        } while ((ulong)uVar15 * 0x30 != lVar17);
      }
      pbVar3 = (this->m_indexedMeshes).m_data;
      if ((pbVar3 != (btIndexedMesh *)0x0) && ((this->m_indexedMeshes).m_ownsMemory == true)) {
        btAlignedFreeInternal(pbVar3);
      }
      (this->m_indexedMeshes).m_ownsMemory = true;
      (this->m_indexedMeshes).m_data = pbVar16;
      (this->m_indexedMeshes).m_capacity = iVar18;
      uVar15 = (this->m_indexedMeshes).m_size;
    }
  }
  pbVar16 = (this->m_indexedMeshes).m_data;
  iVar13 = mesh->m_numTriangles;
  uVar14 = *(undefined4 *)&mesh->field_0x4;
  puVar9 = mesh->m_triangleIndexBase;
  iVar18 = mesh->m_triangleIndexStride;
  iVar12 = mesh->m_numVertices;
  puVar10 = mesh->m_vertexBase;
  PVar11 = mesh->m_indexType;
  uVar4 = *(undefined8 *)&mesh->m_vertexType;
  pbVar3 = pbVar16 + (int)uVar15;
  pbVar3->m_vertexStride = mesh->m_vertexStride;
  pbVar3->m_indexType = PVar11;
  *(undefined8 *)(&pbVar3->m_vertexStride + 2) = uVar4;
  pbVar3 = pbVar16 + (int)uVar15;
  pbVar3->m_triangleIndexStride = iVar18;
  pbVar3->m_numVertices = iVar12;
  *(uchar **)(&pbVar3->m_triangleIndexStride + 2) = puVar10;
  pbVar16 = pbVar16 + (int)uVar15;
  pbVar16->m_numTriangles = iVar13;
  *(undefined4 *)&pbVar16->field_0x4 = uVar14;
  pbVar16->m_triangleIndexBase = puVar9;
  iVar18 = (this->m_indexedMeshes).m_size;
  (this->m_indexedMeshes).m_size = iVar18 + 1;
  (this->m_indexedMeshes).m_data[iVar18].m_indexType = indexType;
  return;
}

Assistant:

void	addIndexedMesh(const btIndexedMesh& mesh, PHY_ScalarType indexType = PHY_INTEGER)
	{
		m_indexedMeshes.push_back(mesh);
		m_indexedMeshes[m_indexedMeshes.size()-1].m_indexType = indexType;
	}